

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O1

void reoProfileWidthPrint(reo_man *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (p->nSupp < 0) {
    uVar2 = 0;
    iVar3 = 0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    lVar4 = 8;
    iVar3 = 0;
    uVar2 = 0;
    do {
      uVar5 = uVar5 + 1;
      printf("Level = %2d. Width = %3d.\n",uVar5 & 0xffffffff,
             (ulong)*(uint *)((long)&p->pPlanes->fSifted + lVar4));
      uVar1 = *(uint *)((long)&p->pPlanes->fSifted + lVar4);
      if ((int)uVar2 <= (int)uVar1) {
        uVar2 = uVar1;
      }
      iVar3 = iVar3 + uVar1;
      lVar4 = lVar4 + 0x38;
    } while ((long)uVar5 < (long)p->nSupp);
  }
  if (p->nWidthCur != iVar3) {
    __assert_fail("p->nWidthCur == TotalWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoProfile.c"
                  ,0x150,"void reoProfileWidthPrint(reo_man *)");
  }
  printf("WIDTH: ");
  printf("Maximum = %5d.  ",(ulong)uVar2);
  printf("Total = %7d.  ",(ulong)(uint)p->nWidthCur);
  printf("Average = %6.2f.\n",(double)((float)iVar3 / (float)p->nSupp));
  return;
}

Assistant:

void reoProfileWidthPrint( reo_man * p )
{
    int WidthMax;
    int TotalWidth;
    int i;

    WidthMax   = 0;
    TotalWidth = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        printf( "Level = %2d. Width = %3d.\n", i, p->pPlanes[i].statsWidth );
        if ( WidthMax < p->pPlanes[i].statsWidth )
             WidthMax = p->pPlanes[i].statsWidth;
        TotalWidth += p->pPlanes[i].statsWidth;
    }
    assert( p->nWidthCur == TotalWidth );
    printf( "WIDTH: " );
    printf( "Maximum = %5d.  ", WidthMax );
    printf( "Total = %7d.  ", p->nWidthCur );
    printf( "Average = %6.2f.\n", TotalWidth / (float)p->nSupp );
}